

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_weakValueDictionary_primitive_at
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t found;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  found = 0;
  _Var1 = sysbvm_weakValueDictionary_find(context,*arguments,arguments[1],&found);
  if (!_Var1) {
    sysbvm_error("Failed to find the expected key in the dictionary.");
  }
  return found;
}

Assistant:

static sysbvm_tuple_t sysbvm_weakValueDictionary_primitive_at(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
    if(!sysbvm_weakValueDictionary_find(context, arguments[0], arguments[1], &found))
        sysbvm_error("Failed to find the expected key in the dictionary.");

    return found;
}